

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

BinaryEventExpressionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::BinaryEventExpressionSyntax,slang::syntax::EventExpressionSyntax&,slang::parsing::Token,slang::syntax::EventExpressionSyntax&>
          (BumpAllocator *this,EventExpressionSyntax *args,Token *args_1,
          EventExpressionSyntax *args_2)

{
  Token operatorToken;
  BinaryEventExpressionSyntax *pBVar1;
  EventExpressionSyntax *in_RCX;
  BumpAllocator *in_RDX;
  BinaryEventExpressionSyntax *in_RSI;
  undefined8 in_RDI;
  Info *unaff_retaddr;
  size_t in_stack_ffffffffffffffd8;
  
  pBVar1 = (BinaryEventExpressionSyntax *)allocate(in_RDX,(size_t)in_RCX,in_stack_ffffffffffffffd8);
  operatorToken.info = unaff_retaddr;
  operatorToken.kind = (short)in_RDI;
  operatorToken._2_1_ = (char)((ulong)in_RDI >> 0x10);
  operatorToken.numFlags.raw = (char)((ulong)in_RDI >> 0x18);
  operatorToken.rawLen = (int)((ulong)in_RDI >> 0x20);
  slang::syntax::BinaryEventExpressionSyntax::BinaryEventExpressionSyntax
            (in_RSI,(EventExpressionSyntax *)in_RDX,operatorToken,in_RCX);
  return pBVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }